

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

size_t phosg::skip_word(string *s,size_t offset)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = s->_M_string_length;
  if (offset < uVar1) {
    do {
      uVar2 = (ulong)(byte)(s->_M_dataplus)._M_p[offset];
      if ((uVar2 < 0x21) && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0)) goto LAB_0010a9fa;
      offset = offset + 1;
      uVar2 = uVar1;
    } while (uVar1 != offset);
  }
  else {
LAB_0010a9fa:
    uVar2 = offset;
    if (offset < uVar1) {
      do {
        uVar2 = (ulong)(byte)(s->_M_dataplus)._M_p[offset];
        if (0x20 < uVar2) {
          return offset;
        }
        if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
          return offset;
        }
        offset = offset + 1;
        uVar2 = uVar1;
      } while (uVar1 != offset);
    }
  }
  return uVar2;
}

Assistant:

size_t skip_word(const string& s, size_t offset) {
  return skip_whitespace(s, skip_non_whitespace(s, offset));
}